

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::
~TraceResolverLinuxImpl
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this)

{
  ~TraceResolverLinuxImpl(this);
  operator_delete(this);
  return;
}

Assistant:

void load_addresses(void *const*addresses, int address_count) override {
    if (address_count == 0) {
      return;
    }
    _symbols.reset(backtrace_symbols(addresses, address_count));
  }